

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool __thiscall cmSystemTools::EnvDiff::ParseOperation(EnvDiff *this,string *envmod)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  optional<std::__cxx11::string> *this_00;
  mapped_type *this_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  char local_549;
  cmAlphaNum local_548;
  cmAlphaNum local_518;
  string local_4e8;
  anon_class_8_1_a8c68091 local_4c8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4c0;
  basic_string_view<char,_std::char_traits<char>_> local_4a0;
  basic_string_view<char,_std::char_traits<char>_> local_490;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_480;
  anon_class_8_1_a8c68091 local_470;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_468;
  basic_string_view<char,_std::char_traits<char>_> local_448;
  basic_string_view<char,_std::char_traits<char>_> local_438;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_428;
  anon_class_16_2_43d9f52a local_418;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_408;
  basic_string_view<char,_std::char_traits<char>_> local_3e8;
  basic_string_view<char,_std::char_traits<char>_> local_3d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3c8;
  anon_class_16_2_43d9f52a local_3b8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3a8;
  basic_string_view<char,_std::char_traits<char>_> local_388;
  basic_string_view<char,_std::char_traits<char>_> local_378;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_368;
  anon_class_8_1_a8c68091 local_358;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_350;
  basic_string_view<char,_std::char_traits<char>_> local_330;
  basic_string_view<char,_std::char_traits<char>_> local_320;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_310;
  anon_class_8_1_a8c68091 local_300;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2f8;
  basic_string_view<char,_std::char_traits<char>_> local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2b8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_260;
  basic_string_view<char,_std::char_traits<char>_> local_250;
  basic_string_view<char,_std::char_traits<char>_> local_240;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_230;
  _Base_ptr local_220;
  _Base_ptr local_218;
  _Self local_210;
  _Self local_208;
  iterator entry;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  size_type value_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  string local_120;
  long local_100;
  size_type colon_loc;
  size_type op_value_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  char local_b9;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  string local_58;
  long local_38;
  size_type eq_loc;
  anon_class_8_1_8991fb9c apply_diff;
  char path_sep;
  string *envmod_local;
  EnvDiff *this_local;
  
  apply_diff.this._7_1_ = GetSystemPathlistSeparator();
  eq_loc = (size_type)this;
  local_38 = std::__cxx11::string::find_first_of((char)envmod,0x3d);
  if (local_38 == -1) {
    cmAlphaNum::cmAlphaNum(&local_88,"Error: Missing `=` after the variable name in: ");
    cmAlphaNum::cmAlphaNum(&local_b8,envmod);
    local_b9 = '\n';
    cmStrCat<char>(&local_58,&local_88,&local_b8,&local_b9);
    Error(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return false;
  }
  std::__cxx11::string::substr((ulong)&op_value_start,(ulong)envmod);
  colon_loc = local_38 + 1;
  local_100 = std::__cxx11::string::find_first_of((char)envmod,0x3a);
  if (local_100 == -1) {
    cmAlphaNum::cmAlphaNum(&local_150,"Error: Missing `:` after the operation in: ");
    cmAlphaNum::cmAlphaNum(&local_180,envmod);
    op.field_2._M_local_buf[0xf] = '\n';
    cmStrCat<char>(&local_120,&local_150,&local_180,op.field_2._M_local_buf + 0xf);
    Error(&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    this_local._7_1_ = false;
    op.field_2._8_4_ = 1;
    goto LAB_004b5bd0;
  }
  std::__cxx11::string::substr((ulong)&value_start,(ulong)envmod);
  value.field_2._8_8_ = local_100 + 1;
  std::__cxx11::string::substr((ulong)local_1d0,(ulong)envmod);
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
  __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("reset",5);
  entry._M_node = (_Base_ptr)__y._M_len;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    local_208._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::find(&this->diff,(key_type *)&op_value_start);
    local_210._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end(&this->diff);
    bVar1 = std::operator!=(&local_208,&local_210);
    if (bVar1) {
      local_218 = local_208._M_node;
      local_220 = (_Base_ptr)
                  std::
                  map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                  ::erase_abi_cxx11_((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                                      *)this,local_208._M_node);
    }
LAB_004b5b8e:
    this_local._7_1_ = true;
  }
  else {
    local_230 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_250 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("set",3);
    local_240 = local_250;
    bVar1 = std::operator==(local_230,local_250);
    if (bVar1) {
      this_00 = (optional<std::__cxx11::string> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->diff,(key_type *)&op_value_start);
      std::optional<std::__cxx11::string>::operator=
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d0);
      goto LAB_004b5b8e;
    }
    local_260 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_280 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("unset",5);
    local_270 = local_280;
    bVar1 = std::operator==(local_260,local_280);
    if (bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_2a8);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->diff,(key_type *)&op_value_start);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(this_01,&local_2a8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_2a8);
      goto LAB_004b5b8e;
    }
    local_2b8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_2d8 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("string_append",0xd);
    local_2c8 = local_2d8;
    bVar1 = std::operator==(local_2b8,local_2d8);
    if (bVar1) {
      local_300.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__0,void>
                ((function<void(std::__cxx11::string&)> *)&local_2f8,&local_300);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_2f8);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_2f8);
      goto LAB_004b5b8e;
    }
    local_310 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_330 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("string_prepend",0xe);
    local_320 = local_330;
    bVar1 = std::operator==(local_310,local_330);
    if (bVar1) {
      local_358.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__1,void>
                ((function<void(std::__cxx11::string&)> *)&local_350,&local_358);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_350);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_350);
      goto LAB_004b5b8e;
    }
    local_368 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_388 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("path_list_append",0x10);
    local_378 = local_388;
    bVar1 = std::operator==(local_368,local_388);
    if (bVar1) {
      local_3b8.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
      local_3b8.path_sep = apply_diff.this._7_1_;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__2,void>
                ((function<void(std::__cxx11::string&)> *)&local_3a8,&local_3b8);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_3a8);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_3a8);
      goto LAB_004b5b8e;
    }
    local_3c8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_3e8 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("path_list_prepend",0x11);
    local_3d8 = local_3e8;
    bVar1 = std::operator==(local_3c8,local_3e8);
    if (bVar1) {
      local_418.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
      local_418.path_sep = apply_diff.this._7_1_;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__3,void>
                ((function<void(std::__cxx11::string&)> *)&local_408,&local_418);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_408);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_408);
      goto LAB_004b5b8e;
    }
    local_428 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_448 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("cmake_list_append",0x11);
    local_438 = local_448;
    bVar1 = std::operator==(local_428,local_448);
    if (bVar1) {
      local_470.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__4,void>
                ((function<void(std::__cxx11::string&)> *)&local_468,&local_470);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_468);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_468);
      goto LAB_004b5b8e;
    }
    local_480 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_4a0 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("cmake_list_prepend",0x12);
    local_490 = local_4a0;
    bVar1 = std::operator==(local_480,local_4a0);
    if (bVar1) {
      local_4c8.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__5,void>
                ((function<void(std::__cxx11::string&)> *)&local_4c0,&local_4c8);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_4c0);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_4c0);
      goto LAB_004b5b8e;
    }
    cmAlphaNum::cmAlphaNum(&local_518,"Error: Unrecognized environment manipulation argument: ");
    cmAlphaNum::cmAlphaNum(&local_548,(string *)&value_start);
    local_549 = '\n';
    cmStrCat<char>(&local_4e8,&local_518,&local_548,&local_549);
    Error(&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    this_local._7_1_ = false;
  }
  op.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)&value_start);
LAB_004b5bd0:
  std::__cxx11::string::~string((string *)&op_value_start);
  return this_local._7_1_;
}

Assistant:

bool cmSystemTools::EnvDiff::ParseOperation(const std::string& envmod)
{
  char path_sep = GetSystemPathlistSeparator();

  auto apply_diff = [this](const std::string& name,
                           std::function<void(std::string&)> const& apply) {
    cm::optional<std::string> old_value = diff[name];
    std::string output;
    if (old_value) {
      output = *old_value;
    } else {
      const char* curval = cmSystemTools::GetEnv(name);
      if (curval) {
        output = curval;
      }
    }
    apply(output);
    diff[name] = output;
  };

  // Split on `=`
  auto const eq_loc = envmod.find_first_of('=');
  if (eq_loc == std::string::npos) {
    cmSystemTools::Error(cmStrCat(
      "Error: Missing `=` after the variable name in: ", envmod, '\n'));
    return false;
  }

  auto const name = envmod.substr(0, eq_loc);

  // Split value on `:`
  auto const op_value_start = eq_loc + 1;
  auto const colon_loc = envmod.find_first_of(':', op_value_start);
  if (colon_loc == std::string::npos) {
    cmSystemTools::Error(
      cmStrCat("Error: Missing `:` after the operation in: ", envmod, '\n'));
    return false;
  }
  auto const op = envmod.substr(op_value_start, colon_loc - op_value_start);

  auto const value_start = colon_loc + 1;
  auto const value = envmod.substr(value_start);

  // Determine what to do with the operation.
  if (op == "reset"_s) {
    auto entry = diff.find(name);
    if (entry != diff.end()) {
      diff.erase(entry);
    }
  } else if (op == "set"_s) {
    diff[name] = value;
  } else if (op == "unset"_s) {
    diff[name] = {};
  } else if (op == "string_append"_s) {
    apply_diff(name, [&value](std::string& output) { output += value; });
  } else if (op == "string_prepend"_s) {
    apply_diff(name,
               [&value](std::string& output) { output.insert(0, value); });
  } else if (op == "path_list_append"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output += path_sep;
      }
      output += value;
    });
  } else if (op == "path_list_prepend"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), path_sep);
      }
      output.insert(0, value);
    });
  } else if (op == "cmake_list_append"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output += ';';
      }
      output += value;
    });
  } else if (op == "cmake_list_prepend"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), ';');
      }
      output.insert(0, value);
    });
  } else {
    cmSystemTools::Error(cmStrCat(
      "Error: Unrecognized environment manipulation argument: ", op, '\n'));
    return false;
  }

  return true;
}